

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O2

void __thiscall
slang::ast::ASTVisitor<CollectLHSSymbols,_true,_true,_false,_false>::
visit<slang::ast::ConditionBinsSelectExpr>
          (ASTVisitor<CollectLHSSymbols,_true,_true,_false,_false> *this,ConditionBinsSelectExpr *t)

{
  if ((t->super_BinsSelectExpr).kind != Invalid) {
    ConditionBinsSelectExpr::visitExprs<CollectLHSSymbols&>(t,(AlwaysFFVisitor *)this);
    return;
  }
  return;
}

Assistant:

bool bad() const { return kind == BinsSelectExprKind::Invalid; }